

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void __thiscall FileHandlePool::returnResourceToPool(FileHandlePool *this,int index)

{
  bool bVar1;
  reference ppPVar2;
  bool inverse;
  PoolEntry *pe;
  memory_order in_stack_00000028;
  bool in_stack_0000002f;
  bool *in_stack_00000030;
  atomic<bool> *in_stack_00000038;
  size_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  ppPVar2 = std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::at
                      ((vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *)
                       CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
  if (*ppPVar2 == (value_type)0x0) {
    fprintf(_stderr,"Invalid entry!\n");
  }
  else {
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_00000038,in_stack_00000030,in_stack_0000002f,in_stack_00000028);
    if (!bVar1) {
      fprintf(_stderr,"Handles were likely used by another thread!");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                    ,0xa3,"void FileHandlePool::returnResourceToPool(int)");
    }
  }
  return;
}

Assistant:

void returnResourceToPool(int index) {
        PoolEntry *pe = pool_vector.at(index);
        if (!pe) {
            fprintf(stderr, "Invalid entry!\n");
            return;
        }
        bool inverse = false;
        if (!pe->available.compare_exchange_strong(inverse, true)) {
            fprintf(stderr, "Handles were likely used by another thread!");
            assert(false);
        }
    }